

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O1

void __thiscall cfdcapi_psbt_UsecaseMultisig_Test::TestBody(cfdcapi_psbt_UsecaseMultisig_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  void *psbt_handle1;
  void *psbt_handle2;
  int ret;
  int64_t amount;
  AssertionResult gtest_ar;
  void *handle;
  char *psbt1;
  char *script;
  char *sighash;
  char *sig;
  char *output;
  char *psbt2;
  char *der_sig;
  void *psbt_handle;
  char *base64;
  int sighash_type;
  char *tx;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  AssertHelper local_d0;
  int local_c4;
  AssertHelper local_c0;
  string local_b8;
  void *local_98;
  AssertHelper local_90;
  AssertHelper local_88;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertHelper local_78;
  AssertHelper local_70;
  AssertHelper local_68;
  AssertHelper local_60;
  AssertHelper local_58;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  char *local_38;
  int local_2c;
  char *local_28;
  
  local_98 = (void *)0x0;
  local_c4 = CfdCreateHandle(&local_98);
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_48.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_48,&local_c4);
  if ((char)local_b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x1ca,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ptr_._0_1_ = local_98 != (void *)0x0;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_98 == (void *)0x0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&local_48,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x1cb,(char *)CONCAT71(local_b8._M_dataplus._M_p._1_7_,
                                       (char)local_b8._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b8._M_dataplus._M_p._1_7_,(char)local_b8._M_dataplus._M_p) !=
        &local_b8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_b8._M_dataplus._M_p._1_7_,(char)local_b8._M_dataplus._M_p));
    }
    if (local_70.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_70.data_ + 8))();
      }
      local_70.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_70.data_ = (AssertHelperData *)0x0;
  pcVar2 = "";
  local_c4 = CfdCreatePsbtHandle(local_98,1,"","",2,0,&local_48.ptr_);
  local_90.data_ = (AssertHelperData *)((ulong)local_90.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&local_c4);
  if ((char)local_b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
      pcVar2 = *(char **)local_b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x1d2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      local_90.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_c4 == 0) {
    pcVar2 = "";
    local_c4 = CfdAddPsbtTxInWithScript
                         (local_98,local_48.ptr_,
                          "544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69",0,
                          0xffffffff,0x1dcd5808,"a914945fb50391a70637c1ffc5ab7fb65308c2f2317587",
                          "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae"
                          ,"","");
    local_90.data_ = local_90.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&local_c4);
    if ((char)local_b8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_90);
      if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x1da,pcVar2);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_90.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_90.data_ + 8))();
        }
        local_90.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdcapiPsbtDumpLog(local_c4,local_98);
    local_c4 = CfdSetPsbtSighashType
                         (local_98,local_48.ptr_,
                          "544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69",0,1);
    local_90.data_ = local_90.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&local_c4);
    if ((char)local_b8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_90);
      if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x1e0,pcVar2);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_90.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_90.data_ + 8))();
        }
        local_90.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdcapiPsbtDumpLog(local_c4,local_98);
    local_c4 = CfdGetPsbtData(local_98,local_48.ptr_,(char **)&local_70,(char **)0x0);
    local_90.data_ = local_90.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&local_c4);
    if ((char)local_b8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_90);
      if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x1e4,pcVar2);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_90.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_90.data_ + 8))();
        }
        local_90.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_90.data_ = (AssertHelperData *)0x0;
    local_68.data_ = (AssertHelperData *)0x0;
    local_38 = (char *)0x0;
    if (local_c4 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_b8,
                 "\"cHNidP8BADMCAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////AAAAAAAAAQEgCFjNHQAAAAAXqRSUX7UDkacGN8H/xat/tlMIwvIxdYcBAwQBAAAAAQQiACCcTayyXruK2ou7Gt24ad6k2BcMyVHx2WlLIVThWDJ2yQEFR1IhA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzIQP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R1KuAA==\""
                 ,"output",
                 "cHNidP8BADMCAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////AAAAAAAAAQEgCFjNHQAAAAAXqRSUX7UDkacGN8H/xat/tlMIwvIxdYcBAwQBAAAAAQQiACCcTayyXruK2ou7Gt24ad6k2BcMyVHx2WlLIVThWDJ2yQEFR1IhA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzIQP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R1KuAA=="
                 ,(char *)local_70.data_);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d8);
        if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x1ea,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_d8.ptr_ + 8))();
          }
          local_d8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_d8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
      pcVar2 = "";
      local_c4 = CfdCreatePsbtHandle(local_98,1,(char *)local_70.data_,"",0,0,&local_d8.ptr_);
      local_d0.data_ = (AssertHelperData *)((ulong)local_d0.data_._4_4_ << 0x20);
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d0,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d0);
        if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x1ef,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_d0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_d0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_d0.data_ + 8))();
          }
          local_d0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdcapiPsbtDumpLog(local_c4,local_98);
      if (local_c4 == 0) {
        local_c4 = CfdSetPsbtTxInBip32Pubkey
                             (local_98,local_d8.ptr_,
                              "544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69",0,
                              "03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3",
                              "2a704760","44h/0h/0h/0/11");
        local_d0.data_ = local_d0.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d0,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d0);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x1f5,pcVar2);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_d0.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_d0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_d0.data_ + 8))();
            }
            local_d0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_c4 = CfdGetPsbtData(local_98,local_d8.ptr_,(char **)&local_90,(char **)0x0);
        local_d0.data_ = local_d0.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d0,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d0);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x1f8,pcVar2);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_d0.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_d0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_d0.data_ + 8))();
            }
            local_d0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_c4 = CfdFreePsbtHandle(local_98,local_d8.ptr_);
        local_d0.data_ = local_d0.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d0,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d0);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x1fb,pcVar2);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_d0.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_d0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_d0.data_ + 8))();
            }
            local_d0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      local_d0.data_ = (AssertHelperData *)0x0;
      pcVar2 = "";
      local_c4 = CfdCreatePsbtHandle(local_98,1,(char *)local_70.data_,"",0,0,&local_d0.data_);
      local_c0.data_ = (AssertHelperData *)((ulong)local_c0.data_._4_4_ << 0x20);
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_c0,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c0);
        if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x201,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_c0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
          local_c0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_c4 == 0) {
        local_c4 = CfdSetPsbtTxInBip32Pubkey
                             (local_98,local_d0.data_,
                              "544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69",0,
                              "03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47",
                              "9d6b6d86","44h/0h/0h/0/11");
        local_c0.data_ = local_c0.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_c0,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_c0);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x206,pcVar2);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_c0.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_c0.data_ + 8))();
            }
            local_c0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_c4 = CfdGetPsbtData(local_98,local_d0.data_,(char **)&local_68,(char **)0x0);
        local_c0.data_ = local_c0.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_c0,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_c0);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x209,pcVar2);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_c0.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_c0.data_ + 8))();
            }
            local_c0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_c4 = CfdFreePsbtHandle(local_98,local_d0.data_);
        local_c0.data_ = local_c0.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_c0,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_c0);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x20c,pcVar2);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_c0.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_c0.data_ + 8))();
            }
            local_c0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      local_c4 = CfdFreeStringBuffer((char *)local_70.data_);
      local_c0.data_ = local_c0.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_c0,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c0);
        if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x210,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_c0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
          local_c0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_70.data_ = (AssertHelperData *)0x0;
    }
    pcVar2 = "";
    local_c4 = CfdAddPsbtTxOutWithScript
                         (local_98,local_48.ptr_,0x1dcd4b10,
                          "00203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc",
                          "522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae"
                          ,"",(uint32_t *)0x0);
    local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
    if ((char)local_b8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_d8);
      if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x217,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_d8.ptr_ + 8))();
        }
        local_d8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_c4 = CfdSetPsbtTxOutBip32Pubkey
                         (local_98,local_48.ptr_,0,
                          "02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b",
                          "2a704760","44h/0h/0h/0/12");
    local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
    if ((char)local_b8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_d8);
      if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x21b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_d8.ptr_ + 8))();
        }
        local_d8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_c4 = CfdSetPsbtTxOutBip32Pubkey
                         (local_98,local_48.ptr_,0,
                          "02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242",
                          "9d6b6d86","44h/0h/0h/0/12");
    local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
    if ((char)local_b8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_d8);
      if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x21f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_d8.ptr_ + 8))();
        }
        local_d8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((local_90.data_ != (AssertHelperData *)0x0) && (local_68.data_ != (AssertHelperData *)0x0))
    {
      local_c4 = CfdJoinPsbt(local_98,local_48.ptr_,(char *)local_90.data_);
      local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d8);
        if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x223,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_d8.ptr_ + 8))();
          }
          local_d8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_c4 = CfdJoinPsbt(local_98,local_48.ptr_,(char *)local_68.data_);
      local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d8);
        if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x226,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_d8.ptr_ + 8))();
          }
          local_d8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_c4 = CfdGetPsbtData(local_98,local_48.ptr_,&local_38,(char **)&local_70);
      local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d8);
        if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x229,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_d8.ptr_ + 8))();
          }
          local_d8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_c4 == 0) {
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_b8,
                   "\"70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000\""
                   ,"output",
                   "70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000"
                   ,(char *)local_70.data_);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d8);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x22b,pcVar2);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_d0);
          if (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_d8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_d8.ptr_ + 8))();
            }
            local_d8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_b8,
                   "\"cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=\""
                   ,"base64",
                   "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA="
                   ,local_38);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d8);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x22c,pcVar2);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_d0);
          if (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_d8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_d8.ptr_ + 8))();
            }
            local_d8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_c4 = CfdFreeStringBuffer((char *)local_70.data_);
        local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d8);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x22f,pcVar2);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_d0);
          if (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_d8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_d8.ptr_ + 8))();
            }
            local_d8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_70.data_ = (AssertHelperData *)0x0;
        local_c4 = CfdFreeStringBuffer(local_38);
        local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d8);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x232,pcVar2);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_d0);
          if (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_d8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_d8.ptr_ + 8))();
            }
            local_d8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_38 = (char *)0x0;
      }
    }
    if (local_90.data_ != (AssertHelperData *)0x0) {
      local_c4 = CfdFreeStringBuffer((char *)local_90.data_);
      local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d8);
        if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x238,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_d8.ptr_ + 8))();
          }
          local_d8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_90.data_ = (AssertHelperData *)0x0;
    }
    if (local_68.data_ != (AssertHelperData *)0x0) {
      local_c4 = CfdFreeStringBuffer((char *)local_68.data_);
      local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d8);
        if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x23d,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_d8.ptr_ + 8))();
          }
          local_d8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_68.data_ = (AssertHelperData *)0x0;
    }
    local_c4 = CfdGetPsbtData(local_98,local_48.ptr_,(char **)&local_70,(char **)0x0);
    local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
    if ((char)local_b8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_d8);
      if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x242,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_d8.ptr_ + 8))();
        }
        local_d8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_c4 == 0) {
      local_d8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
      pcVar2 = "";
      local_c4 = CfdCreatePsbtHandle(local_98,1,(char *)local_70.data_,"",0,0,&local_d8.ptr_);
      local_d0.data_ = local_d0.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d0,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d0);
        if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x248,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_d0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_d0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_d0.data_ + 8))();
          }
          local_d0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_c4 == 0) {
        local_c4 = CfdSignPsbt(local_98,local_d8.ptr_,
                               "ac9aa506601b23ea7362dfcb9350ff3c2edeb67b334258d6489889e67dfa417f",
                               true);
        local_d0.data_ = local_d0.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d0,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d0);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x24b,pcVar2);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_d0.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_d0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_d0.data_ + 8))();
            }
            local_d0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_c4 = CfdGetPsbtData(local_98,local_d8.ptr_,(char **)&local_90,(char **)0x0);
        local_d0.data_ = local_d0.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d0,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d0);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x24e,pcVar2);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_d0.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_d0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_d0.data_ + 8))();
            }
            local_d0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_c4 = CfdFreePsbtHandle(local_98,local_d8.ptr_);
        local_d0.data_ = local_d0.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d0,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d0);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x251,pcVar2);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_d0.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_d0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_d0.data_ + 8))();
            }
            local_d0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      local_d0.data_ = (AssertHelperData *)0x0;
      pcVar2 = "";
      local_c4 = CfdCreatePsbtHandle(local_98,1,(char *)local_70.data_,"",0,0,&local_d0.data_);
      local_c0.data_ = local_c0.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_c0,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c0);
        if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,599,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_c0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
          local_c0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_c4 == 0) {
        local_2c = 0;
        local_c4 = CfdGetPsbtSighashType
                             (local_98,local_d0.data_,
                              "544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69",0,
                              &local_2c);
        local_c0.data_ = local_c0.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_c0,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_c0);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x25f,pcVar2);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_c0.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_c0.data_ + 8))();
            }
            local_c0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_c0.data_._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_b8,"1","sighash_type",(int *)&local_c0,&local_2c);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_c0);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x260,pcVar2);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_c0.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_c0.data_ + 8))();
            }
            local_c0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_c0.data_ = (AssertHelperData *)0x0;
        local_88.data_ = (AssertHelperData *)0x0;
        local_28 = (char *)0x0;
        local_c4 = CfdGetPsbtUtxoData(local_98,local_d0.data_,
                                      "544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69"
                                      ,0,(int64_t *)&local_c0,(char **)0x0,(char **)&local_88,
                                      (char **)0x0,(char **)0x0);
        local_80.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_80.ptr_._4_4_ << 0x20);
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_80);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x266,pcVar2);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_80.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_80.ptr_ + 8))();
            }
            local_80.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        CfdcapiPsbtDumpLog(local_c4,local_98);
        if (local_c4 == 0) {
          local_c4 = CfdGetPsbtGlobalData
                               (local_98,local_d0.data_,(uint32_t *)0x0,&local_28,(uint32_t *)0x0,
                                (uint32_t *)0x0);
          local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_c4);
          if ((char)local_b8._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_80);
            if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)local_b8._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_78,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x26a,pcVar2);
            testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
            testing::internal::AssertHelper::~AssertHelper(&local_78);
            testing::Message::~Message((Message *)&local_80);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_b8);
          if (local_c4 == 0) {
            local_80.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_c4 = CfdCreateSighash(local_98,1,local_28,
                                        "544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69"
                                        ,0,5,
                                        "03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47"
                                        ,(char *)local_88.data_,(int64_t)local_c0.data_,local_2c,
                                        false,(char **)&local_80);
            local_78.data_ = local_78.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_c4
                      );
            if ((char)local_b8._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_78);
              if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = *(char **)local_b8._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x26f,pcVar2);
              testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_78);
              testing::internal::AssertHelper::~AssertHelper(&local_58);
              testing::Message::~Message((Message *)&local_78);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)&local_b8);
            if (local_c4 == 0) {
              local_78.data_ = (AssertHelperData *)0x0;
              local_c4 = CfdCalculateEcSignature
                                   (local_98,(char *)local_80.ptr_,
                                    "973e1d45dca188b0c0ac67bcc5de3ccdbe479d7505bdc43c57231c75f8db55e3"
                                    ,(char *)0x0,1,true,(char **)&local_78);
              local_58.data_ = local_58.data_ & 0xffffffff00000000;
              testing::internal::CmpHelperEQ<CfdErrorCode,int>
                        ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_58,
                         &local_c4);
              if ((char)local_b8._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_58);
                if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = *(char **)local_b8._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_60,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x273,pcVar2);
                testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_60);
                testing::Message::~Message((Message *)&local_58);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)&local_b8);
              if (local_c4 == 0) {
                local_58.data_ = (AssertHelperData *)0x0;
                local_c4 = CfdEncodeSignatureByDer
                                     (local_98,(char *)local_78.data_,local_2c,false,
                                      (char **)&local_58);
                local_60.data_._0_4_ = 0;
                testing::internal::CmpHelperEQ<CfdErrorCode,int>
                          ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,
                           &local_c4);
                if ((char)local_b8._M_dataplus._M_p == '\0') {
                  testing::Message::Message((Message *)&local_60);
                  if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = *(char **)local_b8._M_string_length;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_50,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                             ,0x277,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
                  testing::internal::AssertHelper::~AssertHelper(&local_50);
                  testing::Message::~Message((Message *)&local_60);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)&local_b8);
                if (local_c4 == 0) {
                  local_c4 = CfdSetPsbtSignature(local_98,local_d0.data_,
                                                 "544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69"
                                                 ,0,
                                                 "03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47"
                                                 ,(char *)local_58.data_);
                  local_60.data_._0_4_ = 0;
                  testing::internal::CmpHelperEQ<CfdErrorCode,int>
                            ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,
                             &local_c4);
                  if ((char)local_b8._M_dataplus._M_p == '\0') {
                    testing::Message::Message((Message *)&local_60);
                    if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = *(char **)local_b8._M_string_length;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_50,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                               ,0x27a,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
                    testing::internal::AssertHelper::~AssertHelper(&local_50);
                    testing::Message::~Message((Message *)&local_60);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)&local_b8);
                  local_c4 = CfdFreeStringBuffer((char *)local_58.data_);
                  local_60.data_._0_4_ = 0;
                  testing::internal::CmpHelperEQ<CfdErrorCode,int>
                            ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,
                             &local_c4);
                  if ((char)local_b8._M_dataplus._M_p == '\0') {
                    testing::Message::Message((Message *)&local_60);
                    if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = *(char **)local_b8._M_string_length;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_50,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                               ,0x27d,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
                    testing::internal::AssertHelper::~AssertHelper(&local_50);
                    testing::Message::~Message((Message *)&local_60);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)&local_b8);
                  local_58.data_ = (AssertHelperData *)0x0;
                }
                local_c4 = CfdFreeStringBuffer((char *)local_78.data_);
                local_60.data_._0_4_ = 0;
                testing::internal::CmpHelperEQ<CfdErrorCode,int>
                          ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,
                           &local_c4);
                if ((char)local_b8._M_dataplus._M_p == '\0') {
                  testing::Message::Message((Message *)&local_60);
                  if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = *(char **)local_b8._M_string_length;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_50,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                             ,0x281,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
                  testing::internal::AssertHelper::~AssertHelper(&local_50);
                  testing::Message::~Message((Message *)&local_60);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)&local_b8);
                local_78.data_ = (AssertHelperData *)0x0;
              }
              local_c4 = CfdFreeStringBuffer((char *)local_80.ptr_);
              local_58.data_ = local_58.data_ & 0xffffffff00000000;
              testing::internal::CmpHelperEQ<CfdErrorCode,int>
                        ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_58,
                         &local_c4);
              if ((char)local_b8._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_58);
                if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = *(char **)local_b8._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_60,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x285,pcVar2);
                testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_60);
                testing::Message::~Message((Message *)&local_58);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)&local_b8);
              local_80.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
            local_c4 = CfdFreeStringBuffer(local_28);
            local_78.data_ = local_78.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_c4
                      );
            if ((char)local_b8._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_78);
              if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = *(char **)local_b8._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x289,pcVar2);
              testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_78);
              testing::internal::AssertHelper::~AssertHelper(&local_58);
              testing::Message::~Message((Message *)&local_78);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)&local_b8);
            local_28 = (char *)0x0;
          }
          local_c4 = CfdFreeStringBuffer((char *)local_88.data_);
          local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_c4);
          if ((char)local_b8._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_80);
            if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)local_b8._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_78,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x28d,pcVar2);
            testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
            testing::internal::AssertHelper::~AssertHelper(&local_78);
            testing::Message::~Message((Message *)&local_80);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_b8);
          local_88.data_ = (AssertHelperData *)0x0;
        }
        local_c4 = CfdGetPsbtData(local_98,local_d0.data_,(char **)&local_68,(char **)0x0);
        local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_80);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x292,pcVar2);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_80.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_80.ptr_ + 8))();
            }
            local_80.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_c4 = CfdFreePsbtHandle(local_98,local_d0.data_);
        local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_80);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x295,pcVar2);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_80.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_80.ptr_ + 8))();
            }
            local_80.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      local_c4 = CfdFreeStringBuffer((char *)local_70.data_);
      local_c0.data_ = local_c0.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_c0,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c0);
        if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x299,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_c0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
          local_c0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_70.data_ = (AssertHelperData *)0x0;
    }
    if ((local_90.data_ != (AssertHelperData *)0x0) && (local_68.data_ != (AssertHelperData *)0x0))
    {
      local_c4 = CfdCombinePsbt(local_98,local_48.ptr_,(char *)local_90.data_);
      local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d8);
        if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x29f,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_d8.ptr_ + 8))();
          }
          local_d8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_c4 = CfdCombinePsbt(local_98,local_48.ptr_,(char *)local_68.data_);
      local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d8);
        if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x2a2,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_d8.ptr_ + 8))();
          }
          local_d8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_c4 = CfdGetPsbtData(local_98,local_48.ptr_,&local_38,(char **)&local_70);
      local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d8);
        if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x2a5,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_d8.ptr_ + 8))();
          }
          local_d8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_c4 == 0) {
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_b8,
                   "\"70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000\""
                   ,"output",
                   "70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000"
                   ,(char *)local_70.data_);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d8);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x2a7,pcVar2);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_d0);
          if (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_d8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_d8.ptr_ + 8))();
            }
            local_d8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_b8,
                   "\"cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA\""
                   ,"base64",
                   "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA"
                   ,local_38);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d8);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x2a8,pcVar2);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_d0);
          if (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_d8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_d8.ptr_ + 8))();
            }
            local_d8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_c4 = CfdFreeStringBuffer((char *)local_70.data_);
        local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d8);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x2ab,pcVar2);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_d0);
          if (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_d8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_d8.ptr_ + 8))();
            }
            local_d8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_70.data_ = (AssertHelperData *)0x0;
        local_c4 = CfdFreeStringBuffer(local_38);
        local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d8);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x2ae,pcVar2);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_d0);
          if (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_d8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_d8.ptr_ + 8))();
            }
            local_d8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_38 = (char *)0x0;
      }
    }
    if (local_90.data_ != (AssertHelperData *)0x0) {
      local_c4 = CfdFreeStringBuffer((char *)local_90.data_);
      local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d8);
        if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x2b4,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_d8.ptr_ + 8))();
          }
          local_d8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_90.data_ = (AssertHelperData *)0x0;
    }
    if (local_68.data_ != (AssertHelperData *)0x0) {
      local_c4 = CfdFreeStringBuffer((char *)local_68.data_);
      local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d8);
        if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x2b9,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_d8.ptr_ + 8))();
          }
          local_d8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_68.data_ = (AssertHelperData *)0x0;
    }
    local_c4 = CfdIsFinalizedPsbt(local_98,local_48.ptr_);
    local_d8.ptr_._0_4_ = 7;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_b8,"kCfdSignVerificationError","ret",(CfdErrorCode *)&local_d8,
               &local_c4);
    if ((char)local_b8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_d8);
      if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x2be,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_d8.ptr_ + 8))();
        }
        local_d8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_c4 = CfdSetPsbtFinalizeScript
                         (local_98,local_48.ptr_,
                          "544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69",0,
                          "00473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae"
                         );
    local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
    if ((char)local_b8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_d8);
      if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x2c3,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_d8.ptr_ + 8))();
        }
        local_d8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdcapiPsbtDumpLog(local_c4,local_98);
    local_c4 = CfdIsFinalizedPsbt(local_98,local_48.ptr_);
    local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
    if ((char)local_b8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_d8);
      if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x2c7,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_d8.ptr_ + 8))();
        }
        local_d8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdcapiPsbtDumpLog(local_c4,local_98);
    local_c4 = CfdClearPsbtSignData
                         (local_98,local_48.ptr_,
                          "544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69",0);
    local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
    if ((char)local_b8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_d8);
      if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x2cc,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_d8.ptr_ + 8))();
        }
        local_d8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_c4 = CfdExtractPsbtTransaction(local_98,local_48.ptr_,(char **)&local_70);
    local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
    if ((char)local_b8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_d8);
      if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x2cf,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_d8.ptr_ + 8))();
        }
        local_d8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_c4 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_b8,
                 "\"02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000\""
                 ,"output",
                 "02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000"
                 ,(char *)local_70.data_);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d8);
        if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x2d1,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_d8.ptr_ + 8))();
          }
          local_d8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_c4 = CfdFreeStringBuffer((char *)local_70.data_);
      local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d8);
        if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x2d3,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_d8.ptr_ + 8))();
          }
          local_d8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_70.data_ = (AssertHelperData *)0x0;
    }
    local_c4 = CfdFreePsbtHandle(local_98,local_48.ptr_);
    local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_d8,&local_c4);
    if ((char)local_b8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_d8);
      if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x2d8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_d8.ptr_ + 8))();
        }
        local_d8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  local_c4 = CfdFreeHandle(local_98);
  local_90.data_ = local_90.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_b8,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&local_c4);
  if ((char)local_b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x2dc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      local_90.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_psbt, UsecaseMultisig) {
  // const char* psbt_utxo_sh_wsh_multi = "02000000000102f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0100000017160014c1768dd714526732f54de6c8581a78e385d0900affffffffc6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e4001000000171600141305fd9c86bb2cd2d671928388eccd2b1140aa5affffffff010858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587024730440220032350deae8e8fc60a45800508b09f475ba6043b40ce87f8020a6cc532e401ab02205979d8ad394e19ef9881bb987f77dab465f1112a746ca17a509215c2dbfea93201210206d743464ae738be5ba6d07dd434bed3f24af32f9fad805ffb9a241ec56ea24802473044022051f8776ba287c7424b2d783ebde964e25bde5fec4728735b8b455c806daae16602207988cabc3475109e264a7d378873d0fcee78959c46facdafb099af4ca6eace94012103e241f36e5e17a599c465ec82f3520e6d7a0506cc862de06ff4ba26b255a2f62c00000000";

  auto path1 = "44h/0h/0h/0/12";
  auto key1 = "02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b";
  auto key2 = "02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242";
  auto out_multisig = "522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae";
  // auto addr = "tb1q8jksvxw7vlnzg7nk5ypgzd34cpf52lrt5n77ftqllkq534cwf0xqjsj24p";

  auto in_path = "44h/0h/0h/0/11";
  auto key_in1 = "ac9aa506601b23ea7362dfcb9350ff3c2edeb67b334258d6489889e67dfa417f";
  auto pubkey_in1 = "03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3";
  auto key_in2 = "973e1d45dca188b0c0ac67bcc5de3ccdbe479d7505bdc43c57231c75f8db55e3";
  auto pubkey_in2 = "03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47";
  auto multisig = "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae";

  const char* txid = "544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69";
  uint32_t vout = 0;

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  char* output = nullptr;
  ret = CfdCreatePsbtHandle(
    handle, net_type, "", "", 2, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    // psbt_utxo_sh_wsh_multi
    ret = CfdAddPsbtTxInWithScript(handle, psbt_handle,
        txid, vout,
        0xffffffff, 499996680,
        "a914945fb50391a70637c1ffc5ab7fb65308c2f2317587",
        multisig, "", "");
    EXPECT_EQ(kCfdSuccess, ret);
    CfdcapiPsbtDumpLog(ret, handle);

    ret = CfdSetPsbtSighashType(handle, psbt_handle,
        txid, vout,
        1);
    EXPECT_EQ(kCfdSuccess, ret);
    CfdcapiPsbtDumpLog(ret, handle);

    ret = CfdGetPsbtData(handle, psbt_handle, &output, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    char* psbt1 = nullptr;
    char* psbt2 = nullptr;
    char* base64 = nullptr;
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("cHNidP8BADMCAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////AAAAAAAAAQEgCFjNHQAAAAAXqRSUX7UDkacGN8H/xat/tlMIwvIxdYcBAwQBAAAAAQQiACCcTayyXruK2ou7Gt24ad6k2BcMyVHx2WlLIVThWDJ2yQEFR1IhA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzIQP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R1KuAA==", output);

      void* psbt_handle1 = nullptr;
      ret = CfdCreatePsbtHandle(
        handle, net_type, output, "", 0, 0, &psbt_handle1);
      EXPECT_EQ(kCfdSuccess, ret);
      CfdcapiPsbtDumpLog(ret, handle);
      if (ret == kCfdSuccess) {
        ret = CfdSetPsbtTxInBip32Pubkey(handle, psbt_handle1,
            txid, vout,
            pubkey_in1, "2a704760", in_path);
        EXPECT_EQ(kCfdSuccess, ret);

        ret = CfdGetPsbtData(handle, psbt_handle1, &psbt1, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);

        ret = CfdFreePsbtHandle(handle, psbt_handle1);
        EXPECT_EQ(kCfdSuccess, ret);
      }

      void* psbt_handle2 = nullptr;
      ret = CfdCreatePsbtHandle(
        handle, net_type, output, "", 0, 0, &psbt_handle2);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        ret = CfdSetPsbtTxInBip32Pubkey(handle, psbt_handle2,
            txid, vout,
            pubkey_in2, "9d6b6d86", in_path);
        EXPECT_EQ(kCfdSuccess, ret);

        ret = CfdGetPsbtData(handle, psbt_handle2, &psbt2, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);

        ret = CfdFreePsbtHandle(handle, psbt_handle2);
        EXPECT_EQ(kCfdSuccess, ret);
      }

      ret = CfdFreeStringBuffer(output);
      EXPECT_EQ(kCfdSuccess, ret);
      output = nullptr;
    }

    ret = CfdAddPsbtTxOutWithScript(handle, psbt_handle, 499993360,
        "00203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc",
        out_multisig, "", nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdSetPsbtTxOutBip32Pubkey(handle, psbt_handle, 0,
        key1, "2a704760", path1);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdSetPsbtTxOutBip32Pubkey(handle, psbt_handle, 0,
        key2, "9d6b6d86", path1);
    EXPECT_EQ(kCfdSuccess, ret);

    if ((psbt1 != nullptr) && (psbt2 != nullptr)) {
      ret = CfdJoinPsbt(handle, psbt_handle, psbt1);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdJoinPsbt(handle, psbt_handle, psbt2);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdGetPsbtData(handle, psbt_handle, &base64, &output);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000", output);
        EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=", base64);

        ret = CfdFreeStringBuffer(output);
        EXPECT_EQ(kCfdSuccess, ret);
        output = nullptr;
        ret = CfdFreeStringBuffer(base64);
        EXPECT_EQ(kCfdSuccess, ret);
        base64 = nullptr;
      }
    }
    if (psbt1 != nullptr) {
      ret = CfdFreeStringBuffer(psbt1);
      EXPECT_EQ(kCfdSuccess, ret);
      psbt1 = nullptr;
    }
    if (psbt2 != nullptr) {
      ret = CfdFreeStringBuffer(psbt2);
      EXPECT_EQ(kCfdSuccess, ret);
      psbt2 = nullptr;
    }

    ret = CfdGetPsbtData(handle, psbt_handle, &output, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      // sign psbt
      void* psbt_handle1 = nullptr;
      ret = CfdCreatePsbtHandle(
        handle, net_type, output, "", 0, 0, &psbt_handle1);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        ret = CfdSignPsbt(handle, psbt_handle1, key_in1, true);
        EXPECT_EQ(kCfdSuccess, ret);

        ret = CfdGetPsbtData(handle, psbt_handle1, &psbt1, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);

        ret = CfdFreePsbtHandle(handle, psbt_handle1);
        EXPECT_EQ(kCfdSuccess, ret);
      }

      void* psbt_handle2 = nullptr;
      ret = CfdCreatePsbtHandle(
        handle, net_type, output, "", 0, 0, &psbt_handle2);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        // ret = CfdSignPsbt(handle, psbt_handle2, key_in2, true);
        // EXPECT_EQ(kCfdSuccess, ret);
        // CfdcapiPsbtDumpLog(ret, handle);
        // Same processing.
        int sighash_type = 0;
        ret = CfdGetPsbtSighashType(handle, psbt_handle2, txid, vout, &sighash_type);
        EXPECT_EQ(kCfdSuccess, ret);
        EXPECT_EQ(1, sighash_type);

        int64_t amount = 0;
        char* script = nullptr;
        char* tx = nullptr;
        ret = CfdGetPsbtUtxoData(handle, psbt_handle2, txid, vout, &amount, nullptr, &script, nullptr, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdcapiPsbtDumpLog(ret, handle);
        if (ret == kCfdSuccess) {
          ret = CfdGetPsbtGlobalData(handle, psbt_handle2, nullptr, &tx, nullptr, nullptr);
          EXPECT_EQ(kCfdSuccess, ret);
          if (ret == kCfdSuccess) {
            char* sighash = nullptr;
            ret = CfdCreateSighash(handle, net_type, tx, txid, vout, kCfdP2shP2wsh,
                pubkey_in2, script, amount, sighash_type, false, &sighash);
            EXPECT_EQ(kCfdSuccess, ret);
            if (ret == kCfdSuccess) {
              char* sig = nullptr;
              ret = CfdCalculateEcSignature(handle, sighash, key_in2, nullptr, net_type, true, &sig);
              EXPECT_EQ(kCfdSuccess, ret);
              if (ret == kCfdSuccess) {
                char* der_sig = nullptr;
                ret = CfdEncodeSignatureByDer(handle, sig, sighash_type, false, &der_sig);
                EXPECT_EQ(kCfdSuccess, ret);
                if (ret == kCfdSuccess) {
                  ret = CfdSetPsbtSignature(handle, psbt_handle2, txid, vout, pubkey_in2, der_sig);
                  EXPECT_EQ(kCfdSuccess, ret);

                  ret = CfdFreeStringBuffer(der_sig);
                  EXPECT_EQ(kCfdSuccess, ret);
                  der_sig = nullptr;
                }
                ret = CfdFreeStringBuffer(sig);
                EXPECT_EQ(kCfdSuccess, ret);
                sig = nullptr;
              }
              ret = CfdFreeStringBuffer(sighash);
              EXPECT_EQ(kCfdSuccess, ret);
              sighash = nullptr;
            }
            ret = CfdFreeStringBuffer(tx);
            EXPECT_EQ(kCfdSuccess, ret);
            tx = nullptr;
          }
          ret = CfdFreeStringBuffer(script);
          EXPECT_EQ(kCfdSuccess, ret);
          script = nullptr;
        }

        ret = CfdGetPsbtData(handle, psbt_handle2, &psbt2, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);

        ret = CfdFreePsbtHandle(handle, psbt_handle2);
        EXPECT_EQ(kCfdSuccess, ret);
      }

      ret = CfdFreeStringBuffer(output);
      EXPECT_EQ(kCfdSuccess, ret);
      output = nullptr;
    }

    if ((psbt1 != nullptr) && (psbt2 != nullptr)) {
      ret = CfdCombinePsbt(handle, psbt_handle, psbt1);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdCombinePsbt(handle, psbt_handle, psbt2);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdGetPsbtData(handle, psbt_handle, &base64, &output);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000", output);
        EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA", base64);

        ret = CfdFreeStringBuffer(output);
        EXPECT_EQ(kCfdSuccess, ret);
        output = nullptr;
        ret = CfdFreeStringBuffer(base64);
        EXPECT_EQ(kCfdSuccess, ret);
        base64 = nullptr;
      }
    }
    if (psbt1 != nullptr) {
      ret = CfdFreeStringBuffer(psbt1);
      EXPECT_EQ(kCfdSuccess, ret);
      psbt1 = nullptr;
    }
    if (psbt2 != nullptr) {
      ret = CfdFreeStringBuffer(psbt2);
      EXPECT_EQ(kCfdSuccess, ret);
      psbt2 = nullptr;
    }

    ret = CfdIsFinalizedPsbt(handle, psbt_handle);
    EXPECT_EQ(kCfdSignVerificationError, ret);

    ret = CfdSetPsbtFinalizeScript(handle, psbt_handle,
        txid, vout,
        "00473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae");
    EXPECT_EQ(kCfdSuccess, ret);
    CfdcapiPsbtDumpLog(ret, handle);

    ret = CfdIsFinalizedPsbt(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    CfdcapiPsbtDumpLog(ret, handle);

    ret = CfdClearPsbtSignData(handle, psbt_handle,
        txid, vout);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdExtractPsbtTransaction(handle, psbt_handle, &output);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000", output);
      ret = CfdFreeStringBuffer(output);
      EXPECT_EQ(kCfdSuccess, ret);
      output = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}